

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLutmin.c
# Opt level: O2

int Abc_ObjCheckAbsorb(Abc_Obj_t *pObj,Abc_Obj_t *pPivot,int nLutSize,Vec_Ptr_t *vFanins)

{
  void **ppvVar1;
  Abc_Obj_t *Entry;
  void *Entry_00;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (((*(uint *)&pObj->field_0x14 & 0xf) != 7) || ((*(uint *)&pPivot->field_0x14 & 0xf) != 7)) {
    __assert_fail("Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abcLutmin.c"
                  ,0x3d,"int Abc_ObjCheckAbsorb(Abc_Obj_t *, Abc_Obj_t *, int, Vec_Ptr_t *)");
  }
  vFanins->nSize = 0;
  for (lVar5 = 0; lVar5 < (pObj->vFanins).nSize; lVar5 = lVar5 + 1) {
    Entry = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar5]];
    if (Entry != pPivot) {
      Vec_PtrPush(vFanins,Entry);
    }
  }
  lVar5 = 0;
  do {
    if ((pPivot->vFanins).nSize <= lVar5) {
      return 1;
    }
    Entry_00 = pPivot->pNtk->vObjs->pArray[(pPivot->vFanins).pArray[lVar5]];
    uVar2 = vFanins->nSize;
    uVar3 = 0;
    if (0 < (int)uVar2) {
      uVar3 = (ulong)uVar2;
    }
    uVar4 = 0;
    do {
      if (uVar3 == uVar4) {
        Vec_PtrPush(vFanins,Entry_00);
        uVar2 = vFanins->nSize;
        break;
      }
      ppvVar1 = vFanins->pArray + uVar4;
      uVar4 = uVar4 + 1;
    } while (*ppvVar1 != Entry_00);
    lVar5 = lVar5 + 1;
    if (nLutSize < (int)uVar2) {
      return 0;
    }
  } while( true );
}

Assistant:

int Abc_ObjCheckAbsorb( Abc_Obj_t * pObj, Abc_Obj_t * pPivot, int nLutSize, Vec_Ptr_t * vFanins )
{
    Abc_Obj_t * pFanin;
    int i;
    assert( Abc_ObjIsNode(pObj) && Abc_ObjIsNode(pPivot) );
    // add fanins of the node
    Vec_PtrClear( vFanins );
    Abc_ObjForEachFanin( pObj, pFanin, i )
        if ( pFanin != pPivot )
            Vec_PtrPush( vFanins, pFanin );
    // add fanins of the fanin
    Abc_ObjForEachFanin( pPivot, pFanin, i )
    {
        Vec_PtrPushUnique( vFanins, pFanin );
        if ( Vec_PtrSize(vFanins) > nLutSize )
            return 0;
    }
    return 1;
}